

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O1

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,uint width,uint height,uint pitch,
          color_quad<unsigned_char,_int> *background,uint flags)

{
  uint uVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  ulong uVar3;
  uint min_new_capacity;
  
  this->m_comp_flags = flags;
  (this->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
  (this->m_pixel_buf).m_size = 0;
  (this->m_pixel_buf).m_capacity = 0;
  if (pitch == 0xffffffff) {
    pitch = width;
  }
  min_new_capacity = pitch * height;
  uVar1 = (this->m_pixel_buf).m_size;
  if (uVar1 != min_new_capacity) {
    if ((uVar1 <= min_new_capacity) && ((this->m_pixel_buf).m_capacity < min_new_capacity)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_pixel_buf,min_new_capacity,
                 uVar1 + 1 == min_new_capacity,4,(object_mover)0x0,false);
    }
    (this->m_pixel_buf).m_size = min_new_capacity;
  }
  this->m_width = width;
  this->m_height = height;
  this->m_pitch = pitch;
  this->m_total = min_new_capacity;
  this->m_pPixels = (this->m_pixel_buf).m_p;
  if (min_new_capacity != 0) {
    uVar3 = 0;
    do {
      pcVar2 = this->m_pPixels;
      pcVar2[uVar3].field_0.field_0.r = (background->field_0).field_0.r;
      pcVar2[uVar3].field_0.field_0.g = (background->field_0).field_0.g;
      pcVar2[uVar3].field_0.field_0.b = (background->field_0).field_0.b;
      pcVar2[uVar3].field_0.field_0.a = (background->field_0).field_0.a;
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->m_total);
  }
  return;
}

Assistant:

image(uint width, uint height, uint pitch = UINT_MAX, const color_type& background = color_type::make_black(), uint flags = pixel_format_helpers::cDefaultCompFlags) :
            m_comp_flags(flags)
        {
            CRNLIB_ASSERT((width > 0) && (height > 0));
            if (pitch == UINT_MAX)
            {
                pitch = width;
            }

            m_pixel_buf.resize(pitch * height);

            m_width = width;
            m_height = height;
            m_pitch = pitch;
            m_total = m_pitch * m_height;

            m_pPixels = &m_pixel_buf.front();

            set_all(background);
        }